

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableArrayWalker::GetResolvedObject
          (RecyclableArrayWalker *this,JavascriptArray *arrayObj,int index,
          ResolvedObject *pResolvedObject,uint32 *pabsIndex)

{
  uint index_00;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  uint extraout_var;
  RecyclableArrayWalker *this_00;
  LPCWSTR pWVar7;
  Type TVar8;
  char *this_01;
  char *aValue;
  
  if (arrayObj == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb75,"(arrayObj)","arrayObj");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb76,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  if (this->pAbsoluteIndexList ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb77,"(pAbsoluteIndexList)","pAbsoluteIndexList");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  if ((this->pAbsoluteIndexList->
      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb78,"(pAbsoluteIndexList->Count() > index)",
                                "pAbsoluteIndexList->Count() > index");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  pTVar6 = JsUtil::
           List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this->pAbsoluteIndexList,index);
  index_00 = *pTVar6;
  this_01 = (char *)this;
  iVar3 = (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
            _vptr_IDiagObjectModelWalkerBase[6])(this,arrayObj,(ulong)index_00);
  aValue = (char *)CONCAT44(extraout_var,iVar3);
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if ((RecyclableArrayWalker *)aValue == (RecyclableArrayWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  if ((extraout_var & 0x1ffff) != 0x10000 && (extraout_var & 0xffff0000) == 0x10000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_008c5d26;
    *puVar5 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if (((extraout_var & 0xffff0000) != 0x10000) &&
     (TVar8 = TypeIds_Number, extraout_var >> 0x12 == 0)) {
    this_00 = (RecyclableArrayWalker *)UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableArrayWalker *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      aValue = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008c5d26;
      *puVar5 = 0;
    }
    TVar8 = ((Type *)&(this_00->super_RecyclableObjectWalker).scriptContext)->ptr->typeId;
    this_01 = aValue;
    if (0x57 < (int)TVar8) {
      BVar4 = RecyclableObject::IsExternal((RecyclableObject *)this_00);
      this_01 = (char *)this_00;
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        this_01 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_008c5d26;
        *puVar5 = 0;
      }
    }
  }
  pResolvedObject->typeId = TVar8;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  stringBuilder =
       ((this->super_RecyclableObjectWalker).scriptContext)->threadContext->debugManager->
       pCurrentInterpreterLocation->stringBuilder;
  if (stringBuilder == (StringBuilder<Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
    ;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb82,"(builder)","builder");
    if (!bVar2) {
LAB_008c5d26:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  stringBuilder->length = 0;
  stringBuilder->count = 0;
  stringBuilder->firstChunk = (Data *)0x0;
  stringBuilder->secondChunk = (Data *)0x0;
  stringBuilder->lastChunk = (Data *)0x0;
  pWVar7 = GetIndexName((RecyclableArrayWalker *)this_01,index_00,stringBuilder);
  pResolvedObject->name = pWVar7;
  if (pabsIndex != (uint32 *)0x0) {
    *pabsIndex = index_00;
  }
  return 1;
}

Assistant:

BOOL RecyclableArrayWalker::GetResolvedObject(Js::JavascriptArray* arrayObj, int index, ResolvedObject* pResolvedObject, uint32 * pabsIndex)
    {
        Assert(arrayObj);
        Assert(pResolvedObject);
        Assert(pAbsoluteIndexList);
        Assert(pAbsoluteIndexList->Count() > index);

        // translate i'th Item to the correct array index and return
        uint32 absIndex = pAbsoluteIndexList->Item(index);
        pResolvedObject->obj = FetchItemAt(arrayObj, absIndex);
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        StringBuilder<ArenaAllocator>* builder = GetBuilder();
        Assert(builder);
        builder->Reset();
        pResolvedObject->name = GetIndexName(absIndex, builder);
        if (pabsIndex)
        {
            *pabsIndex = absIndex;
        }

        return TRUE;
    }